

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionEvaluator::withinInstruction
          (SelectionEvaluator *this,Token *instruction,SelectionSet *bs)

{
  bool bVar1;
  int iVar2;
  type_info *ptVar3;
  float fVar4;
  any withinSpec;
  allocator<char> local_49;
  any local_48;
  string local_38;
  
  std::any::any(&local_48,&instruction->value);
  ptVar3 = std::any::type(&local_48);
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&float::typeinfo);
  if (bVar1) {
    fVar4 = std::any_cast<float>(&local_48);
  }
  else {
    ptVar3 = std::any::type(&local_48);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&int::typeinfo);
    if (bVar1) {
      iVar2 = std::any_cast<int>(&local_48);
      fVar4 = (float)iVar2;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"casting error in withinInstruction",&local_49);
      evalError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      SelectionSet::clearAll(bs);
      fVar4 = 0.0;
    }
  }
  DistanceFinder::find((SelectionSet *)&local_38,&this->distanceFinder,bs,(double)fVar4);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            (&bs->bitsets_,&local_38);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_38);
  std::any::reset(&local_48);
  return;
}

Assistant:

void SelectionEvaluator::withinInstruction(const Token& instruction,
                                             SelectionSet& bs) {
    std::any withinSpec = instruction.value;
    float distance(0.0);
    if (withinSpec.type() == typeid(float)) {
      distance = std::any_cast<float>(withinSpec);
    } else if (withinSpec.type() == typeid(int)) {
      distance = std::any_cast<int>(withinSpec);
    } else {
      evalError("casting error in withinInstruction");
      bs.clearAll();
    }

    bs = distanceFinder.find(bs, distance);
  }